

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

int memCmp_fast(void *buf1,void *buf2,size_t count)

{
  octet *b2;
  octet *b1;
  size_t count_local;
  void *buf2_local;
  void *buf1_local;
  
  b2 = (octet *)buf2;
  b1 = (octet *)buf1;
  count_local = count;
  while( true ) {
    if (count_local == 0) {
      return 0;
    }
    if (*b2 < *b1) break;
    if (*b1 < *b2) {
      return -1;
    }
    b1 = b1 + 1;
    b2 = b2 + 1;
    count_local = count_local - 1;
  }
  return 1;
}

Assistant:

int FAST(memCmp)(const void* buf1, const void* buf2, size_t count)
{
	const octet* b1 = (const octet*)buf1;
	const octet* b2 = (const octet*)buf2;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	for (; count--; ++b1, ++b2)
		if (*b1 > *b2)
			return 1;
		else if (*b1 < *b2)
			return -1;
	return 0;
}